

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_log.c
# Opt level: O2

void tap_lfun(SRunner *sr,FILE *file,print_output printmode,void *obj,cl_event evt)

{
  char *pcVar1;
  
  switch(evt) {
  case CLINITLOG_SR:
    tap_lfun::num_tests_run = 0;
    return;
  case CLENDLOG_SR:
    fprintf((FILE *)file,"1..%d\n",(ulong)(uint)tap_lfun::num_tests_run);
    break;
  case CLSTART_SR:
  case CLSTART_S:
  case CLEND_SR:
  case CLEND_S:
  case CLSTART_T:
    return;
  case CLEND_T:
    tap_lfun::num_tests_run = tap_lfun::num_tests_run + 1;
    pcVar1 = "not ok";
    if (*obj == 1) {
      pcVar1 = "ok";
    }
    fprintf((FILE *)file,"%s %d - %s:%s:%s: %s\n",pcVar1,(ulong)(uint)tap_lfun::num_tests_run,
            *(undefined8 *)((long)obj + 8),*(undefined8 *)((long)obj + 0x20),
            *(undefined4 *)((long)obj + 0x28),*(undefined4 *)((long)obj + 0x30));
    break;
  default:
    eprintf("Bad event type received in tap_lfun",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_log.c"
            ,0x17c);
  }
  fflush((FILE *)file);
  return;
}

Assistant:

void tap_lfun(SRunner * sr CK_ATTRIBUTE_UNUSED, FILE * file,
              enum print_output printmode CK_ATTRIBUTE_UNUSED, void *obj,
              enum cl_event evt)
{
    TestResult *tr;

    static int num_tests_run = 0;

    switch (evt)
    {
        case CLINITLOG_SR:
            /* As this is a new log file, reset the number of tests executed */
            num_tests_run = 0;
            break;
        case CLENDLOG_SR:
            /* Output the test plan as the last line */
            fprintf(file, "1..%d\n", num_tests_run);
            fflush(file);
            break;
        case CLSTART_SR:
            break;
        case CLSTART_S:
            break;
        case CLEND_SR:
            break;
        case CLEND_S:
            break;
        case CLSTART_T:
            break;
        case CLEND_T:
            /* Print the test result to the tap file */
            num_tests_run += 1;
            tr = (TestResult *)obj;
            fprintf(file, "%s %d - %s:%s:%s: %s\n",
                    tr->rtype == CK_PASS ? "ok" : "not ok", num_tests_run,
                    tr->file, tr->tcname, tr->tname, tr->msg);
            fflush(file);
            break;
        default:
            eprintf("Bad event type received in tap_lfun", __FILE__,
                    __LINE__);
    }
}